

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

double turbulence(Vector *p,int octaves)

{
  double dVar1;
  int local_44;
  undefined1 local_40 [4];
  int i;
  Vector r;
  double res;
  double k;
  int octaves_local;
  Vector *p_local;
  
  res = 1.0;
  r.z = 0.0;
  Vector::Vector((Vector *)local_40,p);
  TurbulenceCalls = TurbulenceCalls + 1;
  for (local_44 = 0; local_44 < octaves; local_44 = local_44 + 1) {
    dVar1 = noise((Vector *)local_40);
    r.z = dVar1 * res + r.z;
    Vector::operator*=((Vector *)local_40,2.0);
    res = res * 0.5;
  }
  return r.z;
}

Assistant:

double turbulence( const Vector& p, int   octaves  )
{
   double k = 1;
   double res = 0;
   Vector r = p;
   int   i;

   TurbulenceCalls++;

   for( i = 0; i <   octaves; i++ )
   {
      res   += noise(r) * k;
      r *= 2;
      k *= 0.5;
   }
   return res;
}